

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O2

TRANSPORT_LL_HANDLE
IoTHubTransport_MQTT_Common_Create
          (IOTHUBTRANSPORT_CONFIG *config,MQTT_GET_IO_TRANSPORT get_io_transport,
          TRANSPORT_CALLBACKS_INFO *cb_info,void *ctx)

{
  IOTHUB_CLIENT_CONFIG *pIVar1;
  PDLIST_ENTRY pDVar2;
  IOTHUB_AUTHORIZATION_HANDLE pIVar3;
  int iVar4;
  LOGGER_LOG p_Var5;
  size_t sVar6;
  MQTTTRANSPORT_HANDLE_DATA *transport_data;
  TICK_COUNTER_HANDLE pTVar7;
  RETRY_CONTROL_HANDLE pRVar8;
  STRING_HANDLE pSVar9;
  MQTT_CLIENT_HANDLE pMVar10;
  time_t tVar11;
  long lVar12;
  char *pcVar13;
  TRANSPORT_CALLBACKS_INFO *pTVar14;
  char *pcVar15;
  byte bVar16;
  char **local_48;
  char **local_40;
  
  bVar16 = 0;
  if ((get_io_transport == (MQTT_GET_IO_TRANSPORT)0x0 || config == (IOTHUBTRANSPORT_CONFIG *)0x0) ||
      cb_info == (TRANSPORT_CALLBACKS_INFO *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
              ,"IoTHubTransport_MQTT_Common_Create",0xc90,1,
              "Invalid Argument config: %p, get_io_transport: %p, cb_info: %p",config,
              get_io_transport,cb_info);
    return (TRANSPORT_LL_HANDLE)0x0;
  }
  if (config->auth_module_handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar13 = "IoTHubTransport_MQTT_Common_Create";
    pcVar15 = "Invalid Argument: auth_module_handle is NULL)";
    iVar4 = 0xc95;
LAB_0012a2d1:
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
              ,pcVar13,iVar4,1,pcVar15);
    return (TRANSPORT_LL_HANDLE)0x0;
  }
  pIVar1 = config->upperConfig;
  if (((((pIVar1 == (IOTHUB_CLIENT_CONFIG *)0x0) ||
        (pIVar1->protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0)) ||
       (pIVar1->deviceId == (char *)0x0)) ||
      ((pcVar13 = pIVar1->deviceKey, pcVar13 != (char *)0x0 &&
       (pIVar1->deviceSasToken != (char *)0x0)))) ||
     ((pcVar15 = pIVar1->iotHubName, pcVar15 == (char *)0x0 || (pIVar1->iotHubSuffix == (char *)0x0)
      ))) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar13 = "IoTHubTransport_MQTT_Common_Create";
    pcVar15 = "Invalid Argument: upperConfig structure contains an invalid parameter";
    iVar4 = 0xc9f;
    goto LAB_0012a2d1;
  }
  if (config->waitingToSend == (PDLIST_ENTRY)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar13 = "IoTHubTransport_MQTT_Common_Create";
    pcVar15 = "Invalid Argument: waitingToSend is NULL)";
    iVar4 = 0xca4;
    goto LAB_0012a2d1;
  }
  sVar6 = strlen(pIVar1->deviceId);
  if (sVar6 - 0x81 < 0xffffffffffffff80) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar13 = "IoTHubTransport_MQTT_Common_Create";
    pcVar15 = "Invalid Argument: DeviceId is of an invalid size";
    iVar4 = 0xca9;
    goto LAB_0012a2d1;
  }
  if ((pcVar13 != (char *)0x0) && (*pcVar13 == '\0')) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar13 = "IoTHubTransport_MQTT_Common_Create";
    pcVar15 = "Invalid Argument: deviceKey is empty";
    iVar4 = 0xcae;
    goto LAB_0012a2d1;
  }
  if ((pIVar1->deviceSasToken != (char *)0x0) && (*pIVar1->deviceSasToken == '\0')) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar13 = "IoTHubTransport_MQTT_Common_Create";
    pcVar15 = "Invalid Argument: deviceSasToken is empty";
    iVar4 = 0xcb3;
    goto LAB_0012a2d1;
  }
  if (*pcVar15 == '\0') {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar13 = "IoTHubTransport_MQTT_Common_Create";
    pcVar15 = "Invalid Argument: iotHubName is empty";
    iVar4 = 0xcb8;
    goto LAB_0012a2d1;
  }
  iVar4 = IoTHub_Transport_ValidateCallbacks(cb_info);
  if (iVar4 != 0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar13 = "IoTHubTransport_MQTT_Common_Create";
    pcVar15 = "failure checking transport callbacks";
    iVar4 = 0xcbd;
    goto LAB_0012a2d1;
  }
  pIVar1 = config->upperConfig;
  pDVar2 = config->waitingToSend;
  pIVar3 = config->auth_module_handle;
  pcVar13 = config->moduleId;
  transport_data = (MQTTTRANSPORT_HANDLE_DATA *)calloc(1,0x198);
  if (transport_data == (MQTTTRANSPORT_HANDLE_DATA *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (TRANSPORT_LL_HANDLE)0x0;
    }
    pcVar13 = "InitializeTransportHandleData";
    pcVar15 = "Could not create MQTT transport state. Memory allocation failed.";
    iVar4 = 0xbbd;
    goto LAB_0012a2d1;
  }
  pTVar7 = tickcounter_create();
  transport_data->msgTickCounter = pTVar7;
  if (pTVar7 == (TICK_COUNTER_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0012a7da;
    pcVar13 = "Invalid Argument: iotHubName is empty";
    iVar4 = 0xbc4;
  }
  else {
    pRVar8 = retry_control_create(IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER,0);
    transport_data->retry_control_handle = pRVar8;
    if (pRVar8 == (RETRY_CONTROL_HANDLE)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0012a7da;
      pcVar13 = "Failed creating default retry control";
      iVar4 = 0xbca;
    }
    else {
      pSVar9 = STRING_construct(pIVar1->deviceId);
      transport_data->device_id = pSVar9;
      if (pSVar9 == (STRING_HANDLE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0012a7da;
        pcVar13 = "failure constructing device_id.";
        iVar4 = 0xbd0;
      }
      else if (pcVar13 == (char *)0x0) {
        pSVar9 = STRING_construct_sprintf
                           ("%s.%s/devices/%s",pIVar1->iotHubName,pIVar1->iotHubSuffix,
                            pIVar1->deviceId);
        transport_data->devicesAndModulesPath = pSVar9;
        if (pSVar9 != (STRING_HANDLE)0x0) {
          pSVar9 = STRING_construct_sprintf("devices/%s/messages/events/",pIVar1->deviceId);
          goto LAB_0012a638;
        }
LAB_0012a688:
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0012a7da;
        pcVar13 = "failure constructing devicesPath.";
        iVar4 = 0xbdc;
      }
      else {
        pSVar9 = STRING_construct(pcVar13);
        transport_data->module_id = pSVar9;
        if (pSVar9 == (STRING_HANDLE)0x0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0012a7da;
          pcVar13 = "failure constructing module_id.";
          iVar4 = 0xbd6;
        }
        else {
          pSVar9 = STRING_construct_sprintf
                             ("%s.%s/devices/%s/modules/%s",pIVar1->iotHubName,pIVar1->iotHubSuffix,
                              pIVar1->deviceId,pcVar13);
          transport_data->devicesAndModulesPath = pSVar9;
          if (pSVar9 == (STRING_HANDLE)0x0) goto LAB_0012a688;
          pSVar9 = STRING_construct_sprintf
                             ("devices/%s/modules/%s/messages/events/",pIVar1->deviceId,pcVar13);
LAB_0012a638:
          local_40 = &pIVar1->iotHubName;
          local_48 = &pIVar1->iotHubSuffix;
          transport_data->topic_MqttEvent = pSVar9;
          if (pSVar9 == (STRING_HANDLE)0x0) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0012a7da;
            pcVar13 = "Could not create topic_MqttEvent for MQTT";
            iVar4 = 0xbe4;
          }
          else {
            pMVar10 = mqtt_client_init(mqttNotificationCallback,mqttOperationCompleteCallback,
                                       transport_data,processErrorCallback,transport_data);
            transport_data->mqttClient = pMVar10;
            if (pMVar10 == (MQTT_CLIENT_HANDLE)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0012a7da;
              pcVar13 = "failure initializing mqtt client.";
              iVar4 = 0xbed;
            }
            else {
              if (pIVar1->protocolGatewayHostName == (char *)0x0) {
                pSVar9 = STRING_construct_sprintf("%s.%s",*local_40,*local_48);
              }
              else {
                pSVar9 = STRING_construct(pIVar1->protocolGatewayHostName);
              }
              transport_data->hostAddress = pSVar9;
              if (pSVar9 != (STRING_HANDLE)0x0) {
                if (pcVar13 == (char *)0x0) {
                  pSVar9 = STRING_construct_sprintf
                                     ("%s.%s/%s/",pIVar1->iotHubName,pIVar1->iotHubSuffix,
                                      pIVar1->deviceId);
                }
                else {
                  pSVar9 = STRING_construct_sprintf
                                     ("%s.%s/%s/%s/",pIVar1->iotHubName,pIVar1->iotHubSuffix,
                                      pIVar1->deviceId,pcVar13);
                }
                transport_data->configPassedThroughUsername = pSVar9;
                if (pSVar9 != (STRING_HANDLE)0x0) {
                  DList_InitializeListHead(&transport_data->telemetry_waitingForAck);
                  DList_InitializeListHead(&transport_data->ack_waiting_queue);
                  DList_InitializeListHead(&transport_data->pending_get_twin_queue);
                  transport_data->mqttClientStatus = MQTT_CLIENT_STATUS_NOT_CONNECTED;
                  transport_data->isRecoverableError = true;
                  transport_data->packetId = 1;
                  transport_data->waitingToSend = pDVar2;
                  transport_data->currPacketState = CONNECT_TYPE;
                  transport_data->keepAliveValue = 0xf0;
                  transport_data->connect_timeout_in_sec = 0x1e;
                  transport_data->topics_ToSubscribe = 0;
                  tVar11 = get_time((time_t *)0x0);
                  srand((uint)tVar11);
                  transport_data->authorization_module = pIVar3;
                  transport_data->isDestroyCalled = false;
                  transport_data->isRetryExpiredCallbackCalled = false;
                  transport_data->isRegistered = false;
                  transport_data->device_twin_get_sent = false;
                  transport_data->xioTransport = (XIO_HANDLE)0x0;
                  transport_data->portNum = 0;
                  transport_data->isConnectUsernameSet = false;
                  transport_data->auto_url_encode_decode = false;
                  transport_data->conn_attempted = false;
                  transport_data->topic_MqttMessage = (STRING_HANDLE)0x0;
                  transport_data->topic_GetState = (STRING_HANDLE)0x0;
                  transport_data->topic_NotifyState = (STRING_HANDLE)0x0;
                  transport_data->topic_InputQueue = (STRING_HANDLE)0x0;
                  transport_data->topic_DeviceMethods = (STRING_HANDLE)0x0;
                  transport_data->connectFailCount = 0;
                  transport_data->connectTick = 0;
                  transport_data->log_trace = false;
                  transport_data->raw_trace = false;
                  transport_data->get_io_transport = get_io_transport;
                  transport_data->http_proxy_hostname = (char *)0x0;
                  transport_data->http_proxy_username = (char *)0x0;
                  transport_data->http_proxy_password = (char *)0x0;
                  transport_data->transport_ctx = ctx;
                  pTVar14 = &transport_data->transport_callbacks;
                  for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
                    pTVar14->msg_input_cb = cb_info->msg_input_cb;
                    cb_info = (TRANSPORT_CALLBACKS_INFO *)
                              ((long)cb_info + (ulong)bVar16 * -0x10 + 8);
                    pTVar14 = (TRANSPORT_CALLBACKS_INFO *)
                              ((long)pTVar14 + (ulong)bVar16 * -0x10 + 8);
                  }
                  return transport_data;
                }
                goto LAB_0012a7da;
              }
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0012a7da;
              pcVar13 = "failure constructing host address.";
              iVar4 = 0xbfe;
            }
          }
        }
      }
    }
  }
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
            ,"InitializeTransportHandleData",iVar4,1,pcVar13);
LAB_0012a7da:
  freeTransportHandleData(transport_data);
  return (TRANSPORT_LL_HANDLE)0x0;
}

Assistant:

TRANSPORT_LL_HANDLE IoTHubTransport_MQTT_Common_Create(const IOTHUBTRANSPORT_CONFIG* config, MQTT_GET_IO_TRANSPORT get_io_transport, TRANSPORT_CALLBACKS_INFO* cb_info, void* ctx)
{
    PMQTTTRANSPORT_HANDLE_DATA result;
    size_t deviceIdSize;

    if (config == NULL || get_io_transport == NULL || cb_info == NULL)
    {
        LogError("Invalid Argument config: %p, get_io_transport: %p, cb_info: %p", config, get_io_transport, cb_info);
        result = NULL;
    }
    else if (config->auth_module_handle == NULL)
    {
        LogError("Invalid Argument: auth_module_handle is NULL)");
        result = NULL;
    }
    else if (config->upperConfig == NULL ||
        config->upperConfig->protocol == NULL ||
        config->upperConfig->deviceId == NULL ||
        ((config->upperConfig->deviceKey != NULL) && (config->upperConfig->deviceSasToken != NULL)) ||
        config->upperConfig->iotHubName == NULL ||
        config->upperConfig->iotHubSuffix == NULL)
    {
        LogError("Invalid Argument: upperConfig structure contains an invalid parameter");
        result = NULL;
    }
    else if (config->waitingToSend == NULL)
    {
        LogError("Invalid Argument: waitingToSend is NULL)");
        result = NULL;
    }
    else if (((deviceIdSize = strlen(config->upperConfig->deviceId)) > 128U) || (deviceIdSize == 0))
    {
        LogError("Invalid Argument: DeviceId is of an invalid size");
        result = NULL;
    }
    else if ((config->upperConfig->deviceKey != NULL) && (strlen(config->upperConfig->deviceKey) == 0))
    {
        LogError("Invalid Argument: deviceKey is empty");
        result = NULL;
    }
    else if ((config->upperConfig->deviceSasToken != NULL) && (strlen(config->upperConfig->deviceSasToken) == 0))
    {
        LogError("Invalid Argument: deviceSasToken is empty");
        result = NULL;
    }
    else if (strlen(config->upperConfig->iotHubName) == 0)
    {
        LogError("Invalid Argument: iotHubName is empty");
        result = NULL;
    }
    else if (IoTHub_Transport_ValidateCallbacks(cb_info) != 0)
    {
        LogError("failure checking transport callbacks");
        result = NULL;
    }
    else
    {
        result = InitializeTransportHandleData(config->upperConfig, config->waitingToSend, config->auth_module_handle, config->moduleId);
        if (result != NULL)
        {
            result->get_io_transport = get_io_transport;
            result->http_proxy_hostname = NULL;
            result->http_proxy_username = NULL;
            result->http_proxy_password = NULL;

            result->transport_ctx = ctx;
            memcpy(&result->transport_callbacks, cb_info, sizeof(TRANSPORT_CALLBACKS_INFO));
        }
    }
    return result;
}